

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rf5c68.c
# Opt level: O1

void rf5c68_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  int *piVar1;
  size_t __n;
  ushort uVar2;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  long lVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  __s = *outputs;
  __s_00 = outputs[1];
  __n = (ulong)samples * 4;
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  if ((*(long *)((long)info + 0x90) != 0) && (*(char *)((long)info + 0x8a) != '\0')) {
    lVar7 = 0;
    do {
      lVar6 = lVar7 * 0x10;
      if (((*(char *)((long)info + lVar6 + 8) != '\0') &&
          (*(char *)((long)info + lVar6 + 0x14) == '\0')) && (samples != 0)) {
        bVar5 = *(byte *)((long)info + lVar6 + 10);
        uVar4 = (uint)*(byte *)((long)info + lVar6 + 9);
        iVar8 = (bVar5 & 0xf) * uVar4;
        iVar10 = (bVar5 >> 4) * uVar4;
        uVar9 = 0;
        do {
          if (*(code **)((long)info + 0x98) != (code *)0x0) {
            uVar4 = *(uint *)((long)info + lVar6 + 0xc);
            if ((~uVar4 & 0x7ff800) == 0) {
              (**(code **)((long)info + 0x98))(*(undefined8 *)((long)info + 0xa0),uVar4 >> 0x18);
            }
          }
          lVar3 = *(long *)((long)info + 0x90);
          bVar5 = *(byte *)(lVar3 + (ulong)(*(uint *)((long)info + lVar6 + 0xc) >> 0xb & 0xffff));
          if (bVar5 == 0xff) {
            uVar2 = *(ushort *)((long)info + lVar6 + 0x12);
            *(uint *)((long)info + lVar6 + 0xc) = (uint)uVar2 << 0xb;
            bVar5 = *(byte *)(lVar3 + (ulong)uVar2);
            if (bVar5 == 0xff) break;
          }
          piVar1 = (int *)((long)info + lVar6 + 0xc);
          *piVar1 = *piVar1 + (uint)*(ushort *)((long)info + lVar6 + 0x10);
          uVar4 = (uint)bVar5;
          if ((char)bVar5 < '\0') {
            __s[uVar9] = __s[uVar9] + ((uVar4 & 0x7f) * iVar8 >> 5);
            __s_00[uVar9] = __s_00[uVar9] + ((uVar4 & 0x7f) * iVar10 >> 5);
          }
          else {
            __s[uVar9] = __s[uVar9] - (iVar8 * uVar4 >> 5);
            __s_00[uVar9] = __s_00[uVar9] - (uVar4 * iVar10 >> 5);
          }
          uVar9 = uVar9 + 1;
        } while (samples != uVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
  }
  return;
}

Assistant:

static void rf5c68_update(void *info, UINT32 samples, DEV_SMPL **outputs)
{
	rf5c68_state *chip = (rf5c68_state *)info;
	DEV_SMPL *left = outputs[0];
	DEV_SMPL *right = outputs[1];
	UINT8 i;
	UINT32 j;

	/* start with clean buffers */
	memset(left, 0, samples * sizeof(*left));
	memset(right, 0, samples * sizeof(*right));

	/* bail if not enabled */
	if (chip->data == NULL || !chip->enable)
		return;

	/* loop over channels */
	for (i = 0; i < NUM_CHANNELS; i++)
	{
		pcm_channel *chan = &chip->chan[i];

		/* if this channel is active, accumulate samples */
		if (chan->enable && ! chan->Muted)
		{
			int lv = (chan->pan & 0x0f) * chan->env;
			int rv = ((chan->pan >> 4) & 0x0f) * chan->env;

			/* loop over the sample buffer */
			for (j = 0; j < samples; j++)
			{
				int sample;

				/* trigger sample callback */
				if(chip->sample_end_cb)
				{
					if(((chan->addr >> 11) & 0xfff) == 0xfff)
						chip->sample_end_cb(chip->sample_cb_param,(chan->addr >> 11)/0x2000);
				}

				/* fetch the sample and handle looping */
				sample = chip->data[(chan->addr >> 11) & 0xffff];
				if (sample == 0xff)
				{
					chan->addr = chan->loopst << 11;
					sample = chip->data[(chan->addr >> 11) & 0xffff];

					/* if we loop to a loop point, we're effectively dead */
					if (sample == 0xff)
						break;
				}
				chan->addr += chan->step;

				/* add to the buffer */
				if (sample & 0x80)
				{
					sample &= 0x7f;
					left[j] += (sample * lv) >> 5;
					right[j] += (sample * rv) >> 5;
				}
				else
				{
					left[j] -= (sample * lv) >> 5;
					right[j] -= (sample * rv) >> 5;
				}
			}
		}
	}
	
#if 0	// IMO this is completely useless.
	/* now clamp and shift the result (output is only 10 bits) */
	for (j = 0; j < samples; j++)
	{
		DEV_SMPL temp;

		temp = left[j];
		if (temp > 32767) temp = 32767;
		else if (temp < -32768) temp = -32768;
		left[j] = temp & ~0x3f;

		temp = right[j];
		if (temp > 32767) temp = 32767;
		else if (temp < -32768) temp = -32768;
		right[j] = temp & ~0x3f;
	}
#endif
}